

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

void uS::Socket::ssl_io_cb<uWS::WebSocket<false>>(uv_poll_t *p,int status,int events)

{
  long *plVar1;
  long lVar2;
  SSL *s;
  undefined8 *puVar3;
  int iVar4;
  uv_poll_cb p_Var5;
  int iVar6;
  uint uVar7;
  Socket in_stack_00000008;
  Socket in_stack_ffffffffffffffb8;
  undefined4 local_38;
  undefined4 local_34;
  
  if (status < 0) {
    uWS::WebSocket<false>::onEnd(in_stack_00000008);
    return;
  }
  plVar1 = (long *)p->data;
  lVar2 = *plVar1;
  s = (SSL *)plVar1[1];
  if ((plVar1[4] != 0) && (((events & 2U) != 0 || (iVar4 = SSL_want(s), iVar4 == 3)))) {
    local_38 = 1;
    setsockopt((p->io_watcher).fd,6,3,&local_38,4);
    do {
      puVar3 = (undefined8 *)plVar1[4];
      iVar4 = SSL_write((SSL *)plVar1[1],(void *)*puVar3,*(int *)(puVar3 + 1));
      if (puVar3[1] == (long)iVar4) {
        if ((code *)puVar3[3] != (code *)0x0) {
          (*(code *)puVar3[3])(p,puVar3[4],0,puVar3[5]);
        }
        SocketData::Queue::pop((Queue *)(plVar1 + 4));
        if (((Queue *)(plVar1 + 4))->head == (Message *)0x0) {
          iVar6 = 3;
          if (((*(byte *)(plVar1 + 3) & 2) != 0) && (iVar4 = SSL_want((SSL *)plVar1[1]), iVar4 != 2)
             ) {
            *(undefined4 *)(plVar1 + 3) = 1;
            p_Var5 = p->poll_cb;
            uVar7 = 1;
LAB_001168f4:
            iVar6 = 3;
            uv_poll_start(p,uVar7,p_Var5);
          }
        }
        else {
LAB_001168b3:
          iVar6 = 0;
        }
      }
      else {
        if (0 < iVar4) goto LAB_001168b3;
        iVar4 = SSL_get_error((SSL *)plVar1[1],iVar4);
        iVar6 = 3;
        if (iVar4 != 2) {
          if (iVar4 == 3) {
            if ((*(uint *)(plVar1 + 3) & 2) == 0) {
              uVar7 = *(uint *)(plVar1 + 3) | 2;
              *(uint *)(plVar1 + 3) = uVar7;
              p_Var5 = p->poll_cb;
              goto LAB_001168f4;
            }
          }
          else {
            uWS::WebSocket<false>::onEnd(in_stack_ffffffffffffffb8);
            iVar6 = 1;
          }
        }
      }
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return;
    }
    local_34 = 0;
    setsockopt((p->io_watcher).fd,6,3,&local_34,4);
  }
  if ((events & 1U) != 0) {
    while (iVar4 = SSL_read(s,*(void **)(lVar2 + 8),*(int *)(lVar2 + 0x10)), 0 < iVar4) {
      uWS::WebSocket<false>::onData((Socket)p,*(char **)(lVar2 + 8),iVar4);
      iVar4 = uv_is_closing(p);
      if (iVar4 != 0) {
        return;
      }
      if (*(char *)((long)p->data + 0x1c) != '\0') {
        return;
      }
      iVar4 = SSL_pending(s);
      if (iVar4 == 0) {
        return;
      }
    }
    iVar4 = SSL_get_error(s,iVar4);
    if (iVar4 != 2) {
      if (iVar4 == 3) {
        if ((*(uint *)(plVar1 + 3) & 2) == 0) {
          uVar7 = *(uint *)(plVar1 + 3) | 2;
          *(uint *)(plVar1 + 3) = uVar7;
          uv_poll_start(p,uVar7,p->poll_cb);
        }
      }
      else {
        uWS::WebSocket<false>::onEnd(in_stack_ffffffffffffffb8);
      }
    }
  }
  return;
}

Assistant:

static void ssl_io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;
        SSL *ssl = socketData->ssl;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (!socketData->messageQueue.empty() && ((events & UV_WRITABLE) || SSL_want(socketData->ssl) == SSL_READING)) {
            Socket(p).cork(true);
            while (true) {
                SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                int sent = SSL_write(socketData->ssl, messagePtr->data, messagePtr->length);
                if (sent == (ssize_t) messagePtr->length) {
                    if (messagePtr->callback) {
                        messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                    }
                    socketData->messageQueue.pop();
                    if (socketData->messageQueue.empty()) {
                        if ((socketData->poll & UV_WRITABLE) && SSL_want(socketData->ssl) != SSL_WRITING) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                        }
                        break;
                    }
                } else if (sent <= 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                }
            }
            Socket(p).cork(false);
        }

        if (events & UV_READABLE) {
            do {
                int length = SSL_read(ssl, nodeData->recvBuffer, nodeData->recvLength);
                if (length <= 0) {
                    switch (SSL_get_error(ssl, length)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                } else {
                    STATE::onData(p, nodeData->recvBuffer, length);
                    if (Socket(p).isClosed() || Socket(p).isShuttingDown()) {
                        return;
                    }
                }
            } while (SSL_pending(ssl));
        }
    }